

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_encoder.c
# Opt level: O3

lzma_ret lzma_index_buffer_encode(lzma_index *i,uint8_t *out,size_t *out_pos,size_t out_size)

{
  size_t sVar1;
  lzma_ret lVar2;
  lzma_vli lVar3;
  size_t *in_pos;
  uint8_t *in;
  lzma_ret lVar4;
  lzma_index *allocator;
  size_t in_R8;
  lzma_action in_stack_fffffffffffffe68;
  lzma_coder_conflict13 coder;
  
  in_pos = (size_t *)CONCAT71((int7)(out_size >> 8),out == (uint8_t *)0x0 || i == (lzma_index *)0x0)
  ;
  lVar4 = LZMA_PROG_ERROR;
  if ((out_pos != (size_t *)0x0 && (out != (uint8_t *)0x0 && i != (lzma_index *)0x0)) &&
     (sVar1 = *out_pos, *out_pos <= out_size)) {
    lVar3 = lzma_index_size(i);
    lVar4 = LZMA_BUF_ERROR;
    if (lVar3 <= out_size - sVar1) {
      allocator = i;
      lzma_index_iter_init(&coder.iter,i);
      lVar4 = LZMA_OK;
      coder.sequence = SEQ_INDICATOR;
      coder.pos = 0;
      coder.crc32 = 0;
      coder.index = i;
      lVar2 = index_encode(&coder,(lzma_allocator *)allocator,in,in_pos,in_R8,out,out_pos,out_size,
                           in_stack_fffffffffffffe68);
      if (lVar2 != LZMA_STREAM_END) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/common/index_encoder.c"
                      ,0xfb,
                      "lzma_ret lzma_index_buffer_encode(const lzma_index *, uint8_t *, size_t *, size_t)"
                     );
      }
    }
  }
  return lVar4;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_index_buffer_encode(const lzma_index *i,
		uint8_t *out, size_t *out_pos, size_t out_size)
{
	lzma_coder coder;
	size_t out_start;
	lzma_ret ret;

	// Validate the arguments.
	if (i == NULL || out == NULL || out_pos == NULL || *out_pos > out_size)
		return LZMA_PROG_ERROR;

	// Don't try to encode if there's not enough output space.
	if (out_size - *out_pos < lzma_index_size(i))
		return LZMA_BUF_ERROR;

	// The Index encoder needs just one small data structure so we can
	// allocate it on stack.
	index_encoder_reset(&coder, i);

	// Do the actual encoding. This should never fail, but store
	// the original *out_pos just in case.
	out_start = *out_pos;
	ret = index_encode(&coder, NULL, NULL, NULL, 0,
			out, out_pos, out_size, LZMA_RUN);

	if (ret == LZMA_STREAM_END) {
		ret = LZMA_OK;
	} else {
		// We should never get here, but just in case, restore the
		// output position and set the error accordingly if something
		// goes wrong and debugging isn't enabled.
		assert(0);
		*out_pos = out_start;
		ret = LZMA_PROG_ERROR;
	}

	return ret;
}